

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssertionExpr.cpp
# Opt level: O2

int slang::ast::AssertionExpr::bind(int __fd,sockaddr *__addr,socklen_t __len)

{
  int iVar1;
  undefined4 extraout_var;
  AssertionExpr *expr;
  undefined4 in_register_0000003c;
  SyntaxNode *pSVar2;
  
  pSVar2 = (SyntaxNode *)CONCAT44(in_register_0000003c,__fd);
  iVar1 = bind((AssertionExpr *)pSVar2[1].previewNode,(int)__addr,
               (sockaddr *)(ulong)(pSVar2[1].parent == (SyntaxNode *)0x0),0);
  expr = (AssertionExpr *)CONCAT44(extraout_var,iVar1);
  if ((DisableIffSyntax *)pSVar2[1].parent != (DisableIffSyntax *)0x0) {
    expr = DisableIffAssertionExpr::fromSyntax
                     ((DisableIffSyntax *)pSVar2[1].parent,expr,(ASTContext *)__addr);
    expr->syntax = pSVar2[1].parent;
  }
  if (*(TimingControlSyntax **)(pSVar2 + 1) != (TimingControlSyntax *)0x0) {
    expr = ClockingAssertionExpr::fromSyntax
                     (*(TimingControlSyntax **)(pSVar2 + 1),expr,(ASTContext *)__addr);
    expr->syntax = *(SyntaxNode **)(pSVar2 + 1);
  }
  expr->syntax = pSVar2;
  return (int)expr;
}

Assistant:

const AssertionExpr& AssertionExpr::bind(const PropertySpecSyntax& syntax,
                                         const ASTContext& context) {
    ASTContext ctx(context);
    ctx.flags |= ASTFlags::AssignmentDisallowed;

    bool allowDisable = syntax.disable == nullptr;
    auto result = &bind(*syntax.expr, context, allowDisable);

    if (syntax.disable) {
        auto& disable = DisableIffAssertionExpr::fromSyntax(*syntax.disable, *result, context);
        disable.syntax = syntax.disable;
        result = &disable;
    }

    if (syntax.clocking) {
        auto& clocking = ClockingAssertionExpr::fromSyntax(*syntax.clocking, *result, context);
        clocking.syntax = syntax.clocking;
        result = &clocking;
    }

    const_cast<AssertionExpr*>(result)->syntax = &syntax;
    return *result;
}